

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_match_expression_finalise(parser_info *info)

{
  char *s;
  int iVar1;
  size_t sVar2;
  coda_expression *local_28;
  coda_expression *expr;
  parser_info *ppStack_18;
  coda_expression_type result_type;
  parser_info *info_local;
  
  ppStack_18 = info;
  if (info->node->char_data != (char *)0x0) {
    s = info->node->char_data;
    sVar2 = strlen(info->node->char_data);
    iVar1 = is_whitespace(s,(int)sVar2);
    if (iVar1 != 0) {
      free(ppStack_18->node->char_data);
      ppStack_18->node->char_data = (char *)0x0;
    }
  }
  if (ppStack_18->node->char_data == (char *)0x0) {
    coda_set_error(-400,"empty detection expression");
    info_local._4_4_ = -1;
  }
  else {
    iVar1 = coda_expression_from_string(ppStack_18->node->char_data,&local_28);
    if (iVar1 == 0) {
      free(ppStack_18->node->char_data);
      ppStack_18->node->char_data = (char *)0x0;
      *(coda_expression **)((long)ppStack_18->node->data + 8) = local_28;
      iVar1 = coda_expression_get_type(local_28,(coda_expression_type *)((long)&expr + 4));
      if (iVar1 == 0) {
        if (expr._4_4_ == 0) {
          info_local._4_4_ = 0;
        }
        else {
          coda_set_error(-400,"not a boolean expression");
          info_local._4_4_ = -1;
        }
      }
      else {
        info_local._4_4_ = -1;
      }
    }
    else {
      info_local._4_4_ = -1;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int cd_match_expression_finalise(parser_info *info)
{
    coda_expression_type result_type;
    coda_expression *expr;

    if (info->node->char_data != NULL)
    {
        if (is_whitespace(info->node->char_data, (int)strlen(info->node->char_data)))
        {
            free(info->node->char_data);
            info->node->char_data = NULL;
        }
    }
    if (info->node->char_data == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "empty detection expression");
        return -1;
    }

    if (coda_expression_from_string(info->node->char_data, &expr) != 0)
    {
        return -1;
    }
    free(info->node->char_data);
    info->node->char_data = NULL;
    ((coda_detection_rule_entry *)info->node->data)->expression = expr;
    if (coda_expression_get_type(expr, &result_type) != 0)
    {
        return -1;
    }
    if (result_type != coda_expression_boolean)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "not a boolean expression");
        return -1;
    }

    return 0;
}